

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O0

ProcessingResult * __thiscall
HeadersSyncState::ProcessNextHeaders
          (HeadersSyncState *this,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *received_headers,
          bool full_headers_message)

{
  long lVar1;
  bool bVar2;
  byte in_CL;
  HeadersSyncState *in_RSI;
  ProcessingResult *in_RDI;
  long in_FS_OFFSET;
  CBlockHeader *hdr;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *__range3;
  Level in_stack_00000070;
  undefined7 in_stack_00000080;
  ProcessingResult *ret;
  const_iterator __end3;
  const_iterator __begin3;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  char *in_stack_fffffffffffffed0;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee8;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *in_stack_ffffffffffffff28;
  HeadersSyncState *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  ConstevalFormatString<2U> in_stack_ffffffffffffff78;
  string_view in_stack_ffffffffffffff80;
  string_view in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ProcessingResult::ProcessingResult
            ((ProcessingResult *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::empty(in_stack_fffffffffffffed8);
  inline_assertion_check<false,bool>
            ((bool *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),in_stack_fffffffffffffed0,
             (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  bVar2 = std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::empty(in_stack_fffffffffffffed8)
  ;
  if ((!bVar2) &&
     (inline_assertion_check<false,bool>
                ((bool *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),in_stack_fffffffffffffed0,
                 (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)),
     in_RSI->m_download_state != FINAL)) {
    if (in_RSI->m_download_state == PRESYNC) {
      bVar2 = ValidateAndStoreHeadersCommitments
                        (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      in_RDI->success = bVar2;
      if ((in_RDI->success & 1U) != 0) {
        if (((in_CL & 1) == 0) && (in_RSI->m_download_state != REDOWNLOAD)) {
          inline_assertion_check<false,bool>
                    ((bool *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                     (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),in_stack_fffffffffffffed0,
                     (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                      Trace);
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
            in_stack_fffffffffffffed0 =
                 "Initial headers sync aborted with peer=%d: incomplete headers message at height=%i (presync phase)\n"
            ;
            LogPrintFormatInternal<long,long>
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff80,in_stack_ffffffffffffff3c
                       ,0x1cefb79,in_stack_00000070,in_stack_ffffffffffffff78,
                       (long *)CONCAT17(full_headers_message,in_stack_00000080),
                       (long *)received_headers);
          }
        }
        else {
          in_RDI->request_more = true;
        }
      }
    }
    else if (in_RSI->m_download_state == REDOWNLOAD) {
      in_RDI->success = true;
      std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::begin
                ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffffed0);
      std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::end
                ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffffed0);
      while (bVar2 = __gnu_cxx::
                     operator==<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                               ((__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                                 *)in_stack_fffffffffffffed8,
                                (__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                                 *)in_stack_fffffffffffffed0), ((bVar2 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
        ::operator*((__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                     *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        bVar2 = ValidateAndStoreRedownloadedHeader
                          ((HeadersSyncState *)
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                           (CBlockHeader *)in_stack_ffffffffffffff30);
        if (!bVar2) {
          in_RDI->success = false;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
        ::operator++((__normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
                      *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      }
      if ((in_RDI->success & 1U) != 0) {
        PopHeadersReadyForAcceptance(in_RSI);
        std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::operator=
                  (in_stack_fffffffffffffed8,
                   (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffffed0)
        ;
        std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::~vector(in_stack_fffffffffffffed8)
        ;
        bVar2 = std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::empty
                          ((deque<CompressedHeader,_std::allocator<CompressedHeader>_> *)
                           CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        if ((bVar2) && ((in_RSI->m_process_all_remaining_headers & 1U) != 0)) {
          bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                      Trace);
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
            in_stack_fffffffffffffed0 =
                 "Initial headers sync complete with peer=%d: releasing all at height=%i (redownload phase)\n"
            ;
            LogPrintFormatInternal<long,long>
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff80,in_stack_ffffffffffffff3c
                       ,(LogFlags)in_stack_ffffffffffffff30,in_stack_00000070,
                       in_stack_ffffffffffffff78,
                       (long *)CONCAT17(full_headers_message,in_stack_00000080),
                       (long *)received_headers);
          }
        }
        else if ((in_CL & 1) == 0) {
          bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                      Trace);
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
            in_stack_fffffffffffffed0 =
                 "Initial headers sync aborted with peer=%d: incomplete headers message at height=%i (redownload phase)\n"
            ;
            LogPrintFormatInternal<long,long>
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff80,in_stack_ffffffffffffff3c
                       ,(LogFlags)in_stack_ffffffffffffff30,in_stack_00000070,
                       in_stack_ffffffffffffff78,
                       (long *)CONCAT17(full_headers_message,in_stack_00000080),
                       (long *)received_headers);
          }
        }
        else {
          in_RDI->request_more = true;
        }
      }
    }
    if (((in_RDI->success & 1U) == 0) || ((in_RDI->request_more & 1U) == 0)) {
      Finalize((HeadersSyncState *)in_stack_fffffffffffffed0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

HeadersSyncState::ProcessingResult HeadersSyncState::ProcessNextHeaders(const
        std::vector<CBlockHeader>& received_headers, const bool full_headers_message)
{
    ProcessingResult ret;

    Assume(!received_headers.empty());
    if (received_headers.empty()) return ret;

    Assume(m_download_state != State::FINAL);
    if (m_download_state == State::FINAL) return ret;

    if (m_download_state == State::PRESYNC) {
        // During PRESYNC, we minimally validate block headers and
        // occasionally add commitments to them, until we reach our work
        // threshold (at which point m_download_state is updated to REDOWNLOAD).
        ret.success = ValidateAndStoreHeadersCommitments(received_headers);
        if (ret.success) {
            if (full_headers_message || m_download_state == State::REDOWNLOAD) {
                // A full headers message means the peer may have more to give us;
                // also if we just switched to REDOWNLOAD then we need to re-request
                // headers from the beginning.
                ret.request_more = true;
            } else {
                Assume(m_download_state == State::PRESYNC);
                // If we're in PRESYNC and we get a non-full headers
                // message, then the peer's chain has ended and definitely doesn't
                // have enough work, so we can stop our sync.
                LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: incomplete headers message at height=%i (presync phase)\n", m_id, m_current_height);
            }
        }
    } else if (m_download_state == State::REDOWNLOAD) {
        // During REDOWNLOAD, we compare our stored commitments to what we
        // receive, and add headers to our redownload buffer. When the buffer
        // gets big enough (meaning that we've checked enough commitments),
        // we'll return a batch of headers to the caller for processing.
        ret.success = true;
        for (const auto& hdr : received_headers) {
            if (!ValidateAndStoreRedownloadedHeader(hdr)) {
                // Something went wrong -- the peer gave us an unexpected chain.
                // We could consider looking at the reason for failure and
                // punishing the peer, but for now just give up on sync.
                ret.success = false;
                break;
            }
        }

        if (ret.success) {
            // Return any headers that are ready for acceptance.
            ret.pow_validated_headers = PopHeadersReadyForAcceptance();

            // If we hit our target blockhash, then all remaining headers will be
            // returned and we can clear any leftover internal state.
            if (m_redownloaded_headers.empty() && m_process_all_remaining_headers) {
                LogDebug(BCLog::NET, "Initial headers sync complete with peer=%d: releasing all at height=%i (redownload phase)\n", m_id, m_redownload_buffer_last_height);
            } else if (full_headers_message) {
                // If the headers message is full, we need to request more.
                ret.request_more = true;
            } else {
                // For some reason our peer gave us a high-work chain, but is now
                // declining to serve us that full chain again. Give up.
                // Note that there's no more processing to be done with these
                // headers, so we can still return success.
                LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: incomplete headers message at height=%i (redownload phase)\n", m_id, m_redownload_buffer_last_height);
            }
        }
    }

    if (!(ret.success && ret.request_more)) Finalize();
    return ret;
}